

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.hpp
# Opt level: O0

int __thiscall
utils::sigslot<void_(int)>::connect
          (sigslot<void_(int)> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined4 in_register_00000034;
  undefined1 local_38 [8];
  shared_ptr<utils::detail::slot<void_(int)>_> s;
  lock_guard<std::mutex> guard;
  SlotType *slot_local;
  sigslot<void_(int)> *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)
             &s.super___shared_ptr<utils::detail::slot<void_(int)>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (mutex_type *)
             ((list<std::shared_ptr<utils::detail::slot<void_(int)>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_(int)>_>_>_>
               *)CONCAT44(in_register_00000034,__fd) + 1));
  std::make_shared<utils::detail::slot<void(int)>,utils::detail::slot<void(int)>const&>
            ((slot<void_(int)> *)local_38);
  std::__cxx11::
  list<std::shared_ptr<utils::detail::slot<void_(int)>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_(int)>_>_>_>
  ::push_back((list<std::shared_ptr<utils::detail::slot<void_(int)>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_(int)>_>_>_>
               *)CONCAT44(in_register_00000034,__fd),(value_type *)local_38);
  std::weak_ptr<utils::detail::slot<void(int)>>::weak_ptr<utils::detail::slot<void(int)>,void>
            ((weak_ptr<utils::detail::slot<void(int)>> *)this,
             (shared_ptr<utils::detail::slot<void_(int)>_> *)local_38);
  std::shared_ptr<utils::detail::slot<void_(int)>_>::~shared_ptr
            ((shared_ptr<utils::detail::slot<void_(int)>_> *)local_38);
  std::lock_guard<std::mutex>::~lock_guard
            ((lock_guard<std::mutex> *)
             &s.super___shared_ptr<utils::detail::slot<void_(int)>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (int)this;
}

Assistant:

SlotID connect(SlotType const &slot)
    {
        std::lock_guard<std::mutex> guard(m_mutex);
        auto const s = std::make_shared<SlotType>(slot);
        m_slots.push_back(s);
        return s;
    }